

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall
QPDFWriter::setMinimumPDFVersion(QPDFWriter *this,string *version,int extension_level)

{
  element_type *peVar1;
  int min_minor;
  int old_minor;
  int min_major;
  int old_major;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->min_pdf_version)._M_string_length != 0) {
    local_34 = 0;
    local_3c = 0;
    local_38 = 0;
    local_40 = 0;
    parseVersion((QPDFWriter *)peVar1,version,&local_34,&local_3c);
    parseVersion((QPDFWriter *)peVar1,
                 &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->min_pdf_version,&local_38,&local_40);
    if (local_34 < local_38) {
      return;
    }
    if (local_34 <= local_38) {
      if (local_3c < local_40) {
        return;
      }
      if (local_3c <= local_40) {
        peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (extension_level <= peVar1->min_extension_level) {
          return;
        }
        goto LAB_001b1b97;
      }
    }
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  std::__cxx11::string::_M_assign((string *)&peVar1->min_pdf_version);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_001b1b97:
  peVar1->min_extension_level = extension_level;
  return;
}

Assistant:

void
QPDFWriter::setMinimumPDFVersion(std::string const& version, int extension_level)
{
    bool set_version = false;
    bool set_extension_level = false;
    if (m->min_pdf_version.empty()) {
        set_version = true;
        set_extension_level = true;
    } else {
        int old_major = 0;
        int old_minor = 0;
        int min_major = 0;
        int min_minor = 0;
        parseVersion(version, old_major, old_minor);
        parseVersion(m->min_pdf_version, min_major, min_minor);
        int compare = compareVersions(old_major, old_minor, min_major, min_minor);
        if (compare > 0) {
            QTC::TC("qpdf", "QPDFWriter increasing minimum version", extension_level == 0 ? 0 : 1);
            set_version = true;
            set_extension_level = true;
        } else if (compare == 0) {
            if (extension_level > m->min_extension_level) {
                QTC::TC("qpdf", "QPDFWriter increasing extension level");
                set_extension_level = true;
            }
        }
    }

    if (set_version) {
        m->min_pdf_version = version;
    }
    if (set_extension_level) {
        m->min_extension_level = extension_level;
    }
}